

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O3

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
applyHouseholderOnTheRight<Eigen::Matrix<double,2,1,0,2,1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *this,
          Matrix<double,_2,_1,_0,_2,_1> *essential,Scalar *tau,Scalar *workspace)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  Index innerSize;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  scalar_sum_op<double> *psVar12;
  ulong uVar13;
  Index row_3;
  scalar_sum_op<double> *psVar14;
  ulong uVar15;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  tmp_2;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false> right;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
  tmp_1;
  scalar_difference_op<double> local_111;
  undefined1 local_110 [24];
  PointerType local_f8;
  scalar_multiple_op<double> sStack_f0;
  type local_e8;
  Nested pMStack_e0;
  Index local_d8;
  Index local_d0;
  undefined1 local_c8 [24];
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_b0;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>
  local_a0;
  undefined1 local_58 [24];
  scalar_multiple_op<double> local_40;
  
  if (*(long *)(this + 0x10) == 1) {
    uVar15 = *(ulong *)(this + 8);
    if (-1 < (long)uVar15) {
      dVar5 = 1.0 - *tau;
      uVar3 = *(ulong *)this;
      uVar9 = (ulong)((uint)(uVar3 >> 3) & 1);
      if (uVar15 <= uVar9) {
        uVar9 = uVar15;
      }
      if ((uVar3 & 7) != 0) {
        uVar9 = uVar15;
      }
      uVar11 = uVar15 - uVar9 & 0xfffffffffffffffe;
      if (uVar9 != 0) {
        uVar13 = 0;
        do {
          *(double *)(uVar3 + uVar13 * 8) = *(double *)(uVar3 + uVar13 * 8) * dVar5;
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
      lVar10 = uVar11 + uVar9;
      if (0 < (long)uVar11) {
        do {
          pdVar1 = (double *)(*(long *)this + uVar9 * 8);
          dVar7 = pdVar1[1];
          pdVar2 = (double *)(*(long *)this + uVar9 * 8);
          *pdVar2 = *pdVar1 * dVar5;
          pdVar2[1] = dVar7 * dVar5;
          uVar9 = uVar9 + 2;
        } while ((long)uVar9 < lVar10);
      }
      if (lVar10 < (long)uVar15) {
        lVar4 = *(long *)this;
        do {
          *(double *)(lVar4 + lVar10 * 8) = *(double *)(lVar4 + lVar10 * 8) * dVar5;
          lVar10 = lVar10 + 1;
        } while (lVar10 < (long)uVar15);
      }
      return;
    }
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_c8._8_8_ = *(undefined8 *)(this + 8);
  local_c8._0_8_ = workspace;
  if ((long)local_c8._8_8_ < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                  ,0x8a,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  lVar10 = *(long *)this;
  lVar4 = *(long *)(this + 0x20);
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
  .m_data = (PointerType)(lVar10 + lVar4 * 8);
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
  .m_rows.m_value = local_c8._8_8_;
  if (*(long *)(this + 0x10) != 3) {
    __assert_fail("v == T(Value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/util/XprHelper.h"
                  ,0x35,
                  "Eigen::internal::variable_if_dynamic<long, 2>::variable_if_dynamic(T) [T = long, Value = 2]"
                 );
  }
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       *(PointerType *)this;
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = *(long *)(this + 8);
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = *(long *)(this + 0x10);
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       *(Nested *)(this + 0x18);
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_outerStride
       = *(Index *)(this + 0x20);
  psVar12 = (scalar_sum_op<double> *)(ulong)((uint)((ulong)workspace >> 3) & 1);
  if ((ulong)local_c8._8_8_ <= psVar12) {
    psVar12 = (scalar_sum_op<double> *)local_c8._8_8_;
  }
  if (((ulong)workspace & 7) != 0) {
    psVar12 = (scalar_sum_op<double> *)local_c8._8_8_;
  }
  uVar15 = local_c8._8_8_ - (long)psVar12 & 0xfffffffffffffffe;
  if (psVar12 != (scalar_sum_op<double> *)0x0) {
    psVar14 = (scalar_sum_op<double> *)0x0;
    do {
      workspace[(long)psVar14] =
           *(double *)
            (lVar10 + local_a0.
                      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                      .m_xpr.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_outerStride * 8 + lVar4 * 8 + (long)psVar14 * 8) *
           (essential->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array[1] +
           local_a0.
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
           .m_data[(long)psVar14] *
           (essential->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array[0];
      psVar14 = psVar14 + 1;
    } while (psVar12 != psVar14);
  }
  psVar14 = psVar12 + uVar15;
  if (0 < (long)uVar15) {
    do {
      dVar7 = (essential->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
      dVar8 = (essential->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[1];
      dVar5 = dVar8 * (local_a0.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
                       .m_data +
                      (long)(psVar12 +
                            local_a0.
                            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                            .m_xpr.
                            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                            .m_outerStride))[1] +
              dVar7 * (local_a0.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
                       .m_data + (long)psVar12)[1];
      auVar6._8_4_ = SUB84(dVar5,0);
      auVar6._0_8_ = dVar8 * local_a0.
                             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                             .
                             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                             .
                             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
                             .
                             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
                             .m_data[(long)(psVar12 +
                                           local_a0.
                                           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                                           .
                                           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                                           .m_xpr.
                                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                           .
                                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                           .m_outerStride)] +
                     dVar7 * local_a0.
                             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                             .
                             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                             .
                             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
                             .
                             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
                             .m_data[(long)psVar12];
      auVar6._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])(workspace + (long)psVar12) = auVar6;
      psVar12 = psVar12 + 2;
    } while ((long)psVar12 < (long)psVar14);
  }
  for (; (long)psVar14 < (long)local_c8._8_8_; psVar14 = psVar14 + 1) {
    workspace[(long)psVar14] =
         local_a0.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
         .m_data[(long)(psVar14 +
                       local_a0.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                       .m_xpr.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       .m_outerStride)] *
         (essential->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
         array[1] +
         local_a0.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
         .m_data[(long)psVar14] *
         (essential->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
         array[0];
  }
  local_110._0_8_ = *(undefined8 *)this;
  local_110._8_8_ = *(undefined8 *)(this + 8);
  local_a0.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .m_outerStride =
       local_a0.
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
       .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
       .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       m_outerStride;
  if (-1 < (long)local_110._8_8_ || (PointerType)local_110._0_8_ == (PointerType)0x0) {
    local_f8 = *(PointerType *)this;
    sStack_f0.m_other = *(type *)(this + 8);
    local_e8.m_matrix = *(Nested *)(this + 0x10);
    pMStack_e0 = *(Nested *)(this + 0x18);
    local_d8 = *(Index *)(this + 0x20);
    local_d0 = local_d8;
    if (0 < *(long *)(this + 0x10)) {
      local_58._0_8_ = local_c8;
      local_58._8_8_ = local_c8 + 0x18;
      SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>_>
      ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                   *)local_58,
                  (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
                   *)local_110);
      local_40.m_other = *tau;
      local_58._0_8_ = local_c8._0_8_;
      local_58._8_8_ = local_c8._8_8_;
      local_110._0_8_ = *(undefined8 *)this;
      local_110._8_8_ = *(undefined8 *)(this + 8);
      if ((long)local_110._8_8_ < 0 && (PointerType)local_110._0_8_ != (PointerType)0x0)
      goto LAB_0012c293;
      local_f8 = *(PointerType *)this;
      sStack_f0.m_other = *(type *)(this + 8);
      local_e8.m_matrix = *(Nested *)(this + 0x10);
      pMStack_e0 = *(Nested *)(this + 0x18);
      local_d8 = *(Index *)(this + 0x20);
      local_d0 = local_d8;
      if (0 < *(long *)(this + 0x10)) {
        local_b0.m_functor = &local_111;
        local_b0.m_matrix =
             (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
              *)local_110;
        SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                     *)(local_c8 + 0x18),
                    (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)local_58);
        sStack_f0.m_other = *tau;
        local_110._8_8_ = local_c8._0_8_;
        local_110._16_8_ = local_c8._8_8_;
        pMStack_e0 = (Nested)0x0;
        local_d8 = 0;
        local_58._0_8_ = &local_a0;
        local_e8.m_matrix = essential;
        local_58._8_8_ =
             (SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)(local_c8 + 0x18);
        SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::CoeffBasedProduct<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_256>_>
        ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::CoeffBasedProduct<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_256>_>
                     *)local_58,
                    (CoeffBasedProduct<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_256>
                     *)local_110);
        free(pMStack_e0);
        return;
      }
    }
    local_d8 = local_d0;
    __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                  ,0x76,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                 );
  }
LAB_0012c293:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                ,0x94,
                "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Level = 0]"
               );
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential.conjugate();
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.transpose();
  }
}